

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O2

int CompareHuffmanTrees(void *ptr1,void *ptr2)

{
  int iVar1;
  
  if (*ptr2 < *ptr1) {
    iVar1 = -1;
  }
  else {
    if (*ptr2 <= *ptr1) {
      return (uint)(*(int *)((long)ptr2 + 4) <= *(int *)((long)ptr1 + 4)) * 2 + -1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int CompareHuffmanTrees(const void* ptr1, const void* ptr2) {
  const HuffmanTree* const t1 = (const HuffmanTree*)ptr1;
  const HuffmanTree* const t2 = (const HuffmanTree*)ptr2;
  if (t1->total_count > t2->total_count) {
    return -1;
  } else if (t1->total_count < t2->total_count) {
    return 1;
  } else {
    assert(t1->value != t2->value);
    return (t1->value < t2->value) ? -1 : 1;
  }
}